

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.cc
# Opt level: O2

int webrtc::ConvertFloatToByteArray(float value,uint8_t *out_bytes)

{
  int iVar1;
  size_t i;
  long lVar2;
  
  if (out_bytes == (uint8_t *)0x0) {
    iVar1 = -1;
  }
  else {
    iVar1 = 0;
    for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
      out_bytes[lVar2] = SUB41(value,0);
      value = (float)((uint)value >> 8);
    }
  }
  return iVar1;
}

Assistant:

int ConvertFloatToByteArray(float value, uint8_t out_bytes[4]) {
  if (!out_bytes) {
    return -1;
  }

  uint32_t binary_value = bit_cast<uint32_t>(value);
  for (size_t i = 0; i < 4; ++i) {
    out_bytes[i] = binary_value;
    binary_value >>= 8;
  }

  return 0;
}